

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWSImporter::ReadEnvelope(LWSImporter *this,Element *dad,Envelope *fill)

{
  pointer pKVar1;
  bool bVar2;
  uint uVar3;
  PrePostBehaviour PVar4;
  Logger *pLVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  float *out;
  long lStack_80;
  char *c;
  _List_node_base *local_70;
  vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *local_68;
  Envelope *local_60;
  float f;
  undefined8 local_50;
  float local_48 [6];
  
  p_Var6 = (dad->children).
           super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  p_Var7 = (_List_node_base *)&dad->children;
  if (p_Var6 == p_Var7) {
    pLVar5 = DefaultLogger::get();
    Logger::error(pLVar5,"LWS: Envelope descriptions must not be empty");
    return;
  }
  uVar3 = strtoul10((char *)p_Var6[3]._M_next,(char **)0x0);
  local_68 = &fill->keys;
  std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::reserve
            (&fill->keys,(ulong)uVar3);
  local_70 = p_Var7;
  local_60 = fill;
  do {
    while( true ) {
      p_Var6 = p_Var6->_M_next;
      if (p_Var6 == p_Var7) {
        return;
      }
      c = (char *)p_Var6[3]._M_next;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var6 + 1),"Key");
      if (bVar2) break;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var6 + 1),"Behaviors");
      if (bVar2) {
        SkipSpaces<char>(&c);
        PVar4 = strtoul10(c,&c);
        fill->pre = PVar4;
        SkipSpaces<char>(&c);
        PVar4 = strtoul10(c,&c);
        fill->post = PVar4;
      }
    }
    _f = 0.0;
    local_50._0_4_ = 0.0;
    local_50._4_4_ = IT_LINE;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    local_48[4] = 0.0;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::emplace_back<Assimp::LWO::Key>
              (local_68,(Key *)&f);
    pKVar1 = (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    SkipSpaces<char>(&c);
    c = fast_atoreal_move<float>(c,&pKVar1[-1].value,true);
    SkipSpaces<char>(&c);
    c = fast_atoreal_move<float>(c,&f,true);
    pKVar1[-1].time = (double)f;
    uVar3 = strtoul10(c,&c);
    switch(uVar3) {
    case 0:
      pKVar1[-1].inter = IT_TCB;
      goto LAB_0042601b;
    case 1:
    case 2:
      pKVar1[-1].inter = IT_HERM;
LAB_0042601b:
      lStack_80 = 5;
      goto LAB_00426049;
    case 3:
      pKVar1[-1].inter = IT_LINE;
      break;
    case 4:
      pKVar1[-1].inter = IT_STEP;
      break;
    case 5:
      pKVar1[-1].inter = IT_BEZ2;
      lStack_80 = 4;
      goto LAB_00426049;
    default:
      pLVar5 = DefaultLogger::get();
      Logger::error(pLVar5,"LWS: Unknown span type");
    }
    lStack_80 = 0;
LAB_00426049:
    p_Var7 = local_70;
    out = pKVar1[-1].params;
    while (bVar2 = lStack_80 != 0, lStack_80 = lStack_80 + -1, fill = local_60, bVar2) {
      SkipSpaces<char>(&c);
      c = fast_atoreal_move<float>(c,out,true);
      out = out + 1;
    }
  } while( true );
}

Assistant:

void LWSImporter::ReadEnvelope(const LWS::Element& dad, LWO::Envelope& fill )
{
    if (dad.children.empty()) {
        ASSIMP_LOG_ERROR("LWS: Envelope descriptions must not be empty");
        return;
    }

    // reserve enough storage
    std::list< LWS::Element >::const_iterator it = dad.children.begin();;
    fill.keys.reserve(strtoul10(it->tokens[1].c_str()));

    for (++it; it != dad.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        if ((*it).tokens[0] == "Key") {
            fill.keys.push_back(LWO::Key());
            LWO::Key& key = fill.keys.back();

            float f;
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,key.value);
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,f);

            key.time = f;

            unsigned int span = strtoul10(c,&c), num = 0;
            switch (span) {

                case 0:
                    key.inter = LWO::IT_TCB;
                    num = 5;
                    break;
                case 1:
                case 2:
                    key.inter = LWO::IT_HERM;
                    num = 5;
                    break;
                case 3:
                    key.inter = LWO::IT_LINE;
                    num = 0;
                    break;
                case 4:
                    key.inter = LWO::IT_STEP;
                    num = 0;
                    break;
                case 5:
                    key.inter = LWO::IT_BEZ2;
                    num = 4;
                    break;
                default:
                    ASSIMP_LOG_ERROR("LWS: Unknown span type");
            }
            for (unsigned int i = 0; i < num;++i) {
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c,key.params[i]);
            }
        }
        else if ((*it).tokens[0] == "Behaviors") {
            SkipSpaces(&c);
            fill.pre = (LWO::PrePostBehaviour) strtoul10(c,&c);
            SkipSpaces(&c);
            fill.post = (LWO::PrePostBehaviour) strtoul10(c,&c);
        }
    }
}